

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O0

void __thiscall
proto2_unittest::TestAllTypesLite_NestedMessage::SharedCtor
          (TestAllTypesLite_NestedMessage *this,Arena *arena)

{
  Arena *arena_local;
  TestAllTypesLite_NestedMessage *this_local;
  
  google::protobuf::MessageLite::internal_visibility();
  Impl_::Impl_((Impl_ *)&this->field_0);
  memset((void *)((long)&this->field_0 + 0x20),0,0xc);
  return;
}

Assistant:

inline void TestAllTypesLite_NestedMessage::SharedCtor(::_pb::Arena* PROTOBUF_NULLABLE arena) {
  new (&_impl_) Impl_(internal_visibility(), arena);
  ::memset(reinterpret_cast<char *>(&_impl_) +
               offsetof(Impl_, cc_),
           0,
           offsetof(Impl_, bb_) -
               offsetof(Impl_, cc_) +
               sizeof(Impl_::bb_));
}